

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual>::evaluate
          (RelationalOp<rsg::ComputeGreaterOrEqualRange,_rsg::EvaluateGreaterOrEqual> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  Type TVar1;
  long lVar2;
  
  TVar1 = (a.m_type)->m_baseType;
  if (TVar1 == TYPE_FLOAT) {
    lVar2 = 0;
    do {
      dst.super_ConstStridedValueAccess<64>.m_value[lVar2].boolVal =
           b.m_value[lVar2].floatVal <= a.m_value[lVar2].floatVal;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
  }
  else if (TVar1 == TYPE_INT) {
    lVar2 = 0;
    do {
      dst.super_ConstStridedValueAccess<64>.m_value[lVar2].boolVal =
           b.m_value[lVar2].intVal <= a.m_value[lVar2].intVal;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
  }
  return;
}

Assistant:

void RelationalOp<ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());
	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asFloat(compNdx), b.asFloat(compNdx));
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
				dst.asBool(compNdx) = EvaluateComp()(a.asInt(compNdx), b.asInt(compNdx));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}